

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KinDynComputations.cpp
# Opt level: O0

bool __thiscall
iDynTree::KinDynComputations::getRelativeTransform
          (KinDynComputations *this,string *refFrameName,string *frameName,
          MatrixView<double> *refFrame_H_frame)

{
  int iVar1;
  int iVar2;
  int frameIndex;
  int refFrameIndex;
  MatrixView<double> *in_stack_000000c0;
  FrameIndex in_stack_000000c8;
  FrameIndex in_stack_000000d0;
  KinDynComputations *in_stack_000000d8;
  MatrixView<double> *in_stack_ffffffffffffff78;
  KinDynComputations *in_stack_ffffffffffffff80;
  bool local_1;
  
  iVar1 = getFrameIndex(in_stack_ffffffffffffff80,(string *)in_stack_ffffffffffffff78);
  iVar2 = getFrameIndex(in_stack_ffffffffffffff80,(string *)in_stack_ffffffffffffff78);
  if (iVar2 == FRAME_INVALID_INDEX) {
    iDynTree::reportError("KinDynComputations","getRelativeTransform","unknown frameName");
    local_1 = false;
  }
  else if (iVar1 == FRAME_INVALID_INDEX) {
    iDynTree::reportError("KinDynComputations","getRelativeTransform","unknown refFrameName");
    local_1 = false;
  }
  else {
    MatrixView<double>::MatrixView((MatrixView<double> *)(long)iVar1,in_stack_ffffffffffffff78);
    local_1 = getRelativeTransform
                        (in_stack_000000d8,in_stack_000000d0,in_stack_000000c8,in_stack_000000c0);
  }
  return local_1;
}

Assistant:

bool KinDynComputations::getRelativeTransform(const std::string & refFrameName,
                                              const std::string & frameName,
                                              iDynTree::MatrixView<double> refFrame_H_frame)
{
    const int refFrameIndex = getFrameIndex(refFrameName);
    const int frameIndex = getFrameIndex(frameName);
    if( frameIndex == iDynTree::FRAME_INVALID_INDEX )
    {
        reportError("KinDynComputations","getRelativeTransform","unknown frameName");
        return false;
    }
    else if( refFrameIndex == iDynTree::FRAME_INVALID_INDEX )
    {
        reportError("KinDynComputations","getRelativeTransform","unknown refFrameName");
        return false;
    }
    else
    {
        return this->getRelativeTransform(refFrameIndex,frameIndex, refFrame_H_frame);
    }
}